

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_magestaff.cpp
# Opt level: O3

int __thiscall AMageStaffFX2::SpecialMissileHit(AMageStaffFX2 *this,AActor *victim)

{
  AActor *source;
  FName local_c;
  DAngle local_8;
  
  source = (this->super_AActor).target.field_0.p;
  if (source == (AActor *)0x0) {
LAB_005d4090:
    source = (AActor *)0x0;
  }
  else if (((source->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->super_AActor).target.field_0.p = (AActor *)0x0;
    goto LAB_005d4090;
  }
  if (((source == victim) || (victim->player != (player_t *)0x0)) ||
     (((victim->flags2).Value & 0x8000) != 0)) {
    return -1;
  }
  if (source != (AActor *)0x0) {
    if (((source->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_005d40c8;
    (this->super_AActor).target.field_0.p = (AActor *)0x0;
  }
  source = (AActor *)0x0;
LAB_005d40c8:
  local_c.Index = 0x9f;
  local_8.Degrees = 0.0;
  P_DamageMobj(victim,&this->super_AActor,source,10,&local_c,0,&local_8);
  return 1;
}

Assistant:

int AMageStaffFX2::SpecialMissileHit (AActor *victim)
{
	if (victim != target &&
		!victim->player &&
		!(victim->flags2 & MF2_BOSS))
	{
		P_DamageMobj (victim, this, target, 10, NAME_Fire);
		return 1;	// Keep going
	}
	return -1;
}